

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::verify
          (TextureGather2DCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  const_reference gatherArgs;
  undefined7 extraout_var;
  Texture2DView TVar2;
  Vector<float,_2> *local_98;
  Texture2DView local_90;
  Texture2DView local_80 [2];
  vector<float,_std::allocator<float>_> local_60;
  Vector<float,_2> local_48;
  Vec2 texCoords [4];
  ConstPixelBufferAccess *rendered_local;
  int iterationNdx_local;
  TextureGather2DCase *this_local;
  
  local_98 = &local_48;
  do {
    tcu::Vector<float,_2>::Vector(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != texCoords + 3);
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_60,this,(ulong)ctx & 0xffffffff);
  computeTexCoordVecs<2>(&local_60,(Vector<float,_2> (*) [4])&local_48);
  std::vector<float,_std::allocator<float>_>::~vector(&local_60);
  TVar2 = tcu::Texture2D::operator_cast_to_Texture2DView(&this->m_swizzledTexture);
  local_90.m_levels = TVar2.m_levels;
  local_90.m_numLevels = TVar2.m_numLevels;
  TVar2 = getOneLevelSubView(&local_90,(this->super_TextureGatherCase).m_baseLevel);
  local_80[0].m_levels = TVar2.m_levels;
  local_80[0].m_numLevels = TVar2.m_numLevels;
  gatherArgs = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
               ::operator[](&this->m_iterations,(long)(int)ctx);
  bVar1 = Functional::(anonymous_namespace)::TextureGatherCase::
          verify<tcu::Texture2DView,tcu::Vector<float,2>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,local_80,
                     (Vector<float,_2> (*) [4])&local_48,gatherArgs);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool TextureGather2DCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec2 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx]);
}